

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Token * __thiscall llvm::yaml::Scanner::getNext(Token *__return_storage_ptr__,Scanner *this)

{
  list_type *this_00;
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Token *pTVar5;
  
  pTVar5 = peekNext(this);
  uVar2 = *(undefined4 *)&pTVar5->field_0x4;
  uVar3 = *(undefined4 *)&(pTVar5->Range).Data;
  uVar4 = *(undefined4 *)((long)&(pTVar5->Range).Data + 4);
  __return_storage_ptr__->Kind = pTVar5->Kind;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->Range).Data = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->Range).Data + 4) = uVar4;
  (__return_storage_ptr__->Range).Length = (pTVar5->Range).Length;
  (__return_storage_ptr__->Value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->Value).field_2;
  pcVar1 = (pTVar5->Value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->Value,pcVar1,
             pcVar1 + (pTVar5->Value)._M_string_length);
  this_00 = &(this->TokenQueue).List;
  if ((this->TokenQueue).List.Sentinel.
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Prev != (ilist_node_base<false> *)this_00) {
    simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
    ::
    eraseAndDispose<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Disposer>
              ((simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
                *)this_00,
               (node_pointer)
               (this->TokenQueue).List.Sentinel.
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Next,(Disposer)&this->TokenQueue);
  }
  if ((this_00->Sentinel).
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Prev == (ilist_node_base<false> *)this_00) {
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::resetAlloc(&this->TokenQueue);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Scanner::getNext() {
  Token Ret = peekNext();
  // TokenQueue can be empty if there was an error getting the next token.
  if (!TokenQueue.empty())
    TokenQueue.pop_front();

  // There cannot be any referenced Token's if the TokenQueue is empty. So do a
  // quick deallocation of them all.
  if (TokenQueue.empty())
    TokenQueue.resetAlloc();

  return Ret;
}